

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O3

amqp_rpc_reply_t *
simple_rpc_inner(amqp_rpc_reply_t *__return_storage_ptr__,amqp_connection_state_t state,
                amqp_channel_t channel,amqp_method_number_t request_id,
                amqp_method_number_t *expected_reply_ids,void *decoded_request_method,
                amqp_time_t deadline)

{
  amqp_method_number_t aVar1;
  int iVar2;
  amqp_time_t deadline_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  amqp_pool_t *pool;
  undefined8 *puVar3;
  amqp_link_t *paVar4;
  amqp_method_number_t aVar5;
  amqp_link_t *paVar6;
  amqp_response_type_enum aVar7;
  amqp_method_number_t *paVar8;
  amqp_frame_t frame;
  amqp_frame_t local_78;
  
  deadline_00 = amqp_time_infinite();
  local_78.frame_type = '\x01';
  local_78.channel = channel;
  local_78.payload.method.id = request_id;
  local_78.payload.method.decoded = decoded_request_method;
  iVar2 = amqp_send_frame_inner(state,&local_78,0,deadline_00);
  if (iVar2 < 0) {
    __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    __return_storage_ptr__->library_error = iVar2;
    return (amqp_rpc_reply_t *)CONCAT44(extraout_var,iVar2);
  }
  while( true ) {
    iVar2 = wait_frame_inner(state,&local_78,deadline);
    if (iVar2 != 0) {
      if (iVar2 == -0xd) {
        (*state->socket->klass->close)(state->socket,AMQP_SC_FORCE);
        __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
        __return_storage_ptr__->library_error = -0xd;
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
      __return_storage_ptr__->library_error = iVar2;
      return (amqp_rpc_reply_t *)CONCAT44(extraout_var_00,iVar2);
    }
    if (local_78.frame_type == '\x01') break;
LAB_00108bae:
    pool = amqp_get_or_create_channel_pool(state,local_78.channel);
    if (pool == (amqp_pool_t *)0x0) {
LAB_00108c74:
      __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
      __return_storage_ptr__->library_error = -1;
      return __return_storage_ptr__;
    }
    puVar3 = (undefined8 *)amqp_pool_alloc(pool,0x30);
    paVar4 = (amqp_link_t *)amqp_pool_alloc(pool,0x10);
    if ((puVar3 == (undefined8 *)0x0) || (paVar4 == (amqp_link_t *)0x0)) goto LAB_00108c74;
    puVar3[4] = local_78.payload.properties.raw.len;
    puVar3[5] = local_78.payload.properties.raw.bytes;
    puVar3[2] = local_78.payload.method.decoded;
    puVar3[3] = local_78.payload.properties.decoded;
    *puVar3 = CONCAT44(local_78._4_4_,
                       CONCAT22(local_78.channel,CONCAT11(local_78._1_1_,local_78.frame_type)));
    puVar3[1] = CONCAT44(local_78.payload.body_fragment.len._4_4_,local_78.payload.method.id);
    paVar4->next = (amqp_link_t_ *)0x0;
    paVar4->data = puVar3;
    paVar6 = state->last_queued_frame;
    if (state->last_queued_frame == (amqp_link_t *)0x0) {
      paVar6 = (amqp_link_t *)&state->first_queued_frame;
    }
    paVar6->next = paVar4;
    state->last_queued_frame = paVar4;
  }
  if (local_78.channel == channel) {
    aVar5 = *expected_reply_ids;
    paVar8 = expected_reply_ids + 1;
    aVar1 = aVar5;
    while (aVar1 != 0) {
      if (aVar1 == local_78.payload.method.id) goto LAB_00108c99;
      aVar1 = *paVar8;
      paVar8 = paVar8 + 1;
    }
    if (local_78.payload.method.id != 0x140028) goto LAB_00108b92;
  }
  else {
LAB_00108b92:
    if (local_78.payload.method.id != 0xa0032 || local_78.channel != 0) goto LAB_00108bae;
    aVar5 = *expected_reply_ids;
  }
LAB_00108c99:
  aVar7 = AMQP_RESPONSE_SERVER_EXCEPTION;
  if (aVar5 != 0) {
    paVar8 = expected_reply_ids + 1;
    do {
      if (aVar5 == local_78.payload.method.id) {
        aVar7 = AMQP_RESPONSE_NORMAL;
        break;
      }
      aVar5 = *paVar8;
      paVar8 = paVar8 + 1;
    } while (aVar5 != 0);
  }
  __return_storage_ptr__->reply_type = aVar7;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
  *(ulong *)&__return_storage_ptr__->reply =
       CONCAT44(local_78.payload.body_fragment.len._4_4_,local_78.payload.method.id);
  (__return_storage_ptr__->reply).decoded = local_78.payload.method.decoded;
  *(undefined8 *)&__return_storage_ptr__->library_error = 0;
  return (amqp_rpc_reply_t *)(ulong)local_78.payload.method.id;
}

Assistant:

static amqp_rpc_reply_t simple_rpc_inner(
    amqp_connection_state_t state, amqp_channel_t channel,
    amqp_method_number_t request_id, amqp_method_number_t *expected_reply_ids,
    void *decoded_request_method, amqp_time_t deadline) {
  int status;
  amqp_rpc_reply_t result;

  memset(&result, 0, sizeof(result));

  status = amqp_send_method(state, channel, request_id, decoded_request_method);
  if (status < 0) {
    return amqp_rpc_reply_error(status);
  }

  {
    amqp_frame_t frame;

  retry:
    status = wait_frame_inner(state, &frame, deadline);
    if (status != AMQP_STATUS_OK) {
      if (status == AMQP_STATUS_TIMEOUT) {
        amqp_socket_close(state->socket, AMQP_SC_FORCE);
      }
      return amqp_rpc_reply_error(status);
    }

    /*
     * We store the frame for later processing unless it's something
     * that directly affects us here, namely a method frame that is
     * either
     *  - on the channel we want, and of the expected type, or
     *  - on the channel we want, and a channel.close frame, or
     *  - on channel zero, and a connection.close frame.
     */
    if (!((frame.frame_type == AMQP_FRAME_METHOD) &&
          (((frame.channel == channel) &&
            (amqp_id_in_reply_list(frame.payload.method.id,
                                   expected_reply_ids) ||
             (frame.payload.method.id == AMQP_CHANNEL_CLOSE_METHOD))) ||
           ((frame.channel == 0) &&
            (frame.payload.method.id == AMQP_CONNECTION_CLOSE_METHOD))))) {
      amqp_pool_t *channel_pool;
      amqp_frame_t *frame_copy;
      amqp_link_t *link;

      channel_pool = amqp_get_or_create_channel_pool(state, frame.channel);
      if (NULL == channel_pool) {
        return amqp_rpc_reply_error(AMQP_STATUS_NO_MEMORY);
      }

      frame_copy = amqp_pool_alloc(channel_pool, sizeof(amqp_frame_t));
      link = amqp_pool_alloc(channel_pool, sizeof(amqp_link_t));

      if (frame_copy == NULL || link == NULL) {
        return amqp_rpc_reply_error(AMQP_STATUS_NO_MEMORY);
      }

      *frame_copy = frame;

      link->next = NULL;
      link->data = frame_copy;

      if (state->last_queued_frame == NULL) {
        state->first_queued_frame = link;
      } else {
        state->last_queued_frame->next = link;
      }
      state->last_queued_frame = link;

      goto retry;
    }

    result.reply_type =
        (amqp_id_in_reply_list(frame.payload.method.id, expected_reply_ids))
            ? AMQP_RESPONSE_NORMAL
            : AMQP_RESPONSE_SERVER_EXCEPTION;

    result.reply = frame.payload.method;
    return result;
  }
}